

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskscheduler.cpp
# Opt level: O1

void __thiscall TaskScheduler::start(TaskScheduler *this)

{
  _Map_pointer ppfVar1;
  int iVar2;
  long lVar3;
  int n;
  int finished;
  int total;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  mutex ex2;
  mutex ex;
  int local_c4;
  long *local_c0;
  thread local_b8;
  undefined4 local_b0;
  int local_ac;
  vector<std::thread,_std::allocator<std::thread>_> local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  ppfVar1 = (this->tasks).c.
            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  local_ac = (int)((ulong)((long)(this->tasks).c.
                                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)(this->tasks).c.
                                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
             (int)((ulong)((long)(this->tasks).c.
                                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->tasks).c.
                                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
             ((((uint)((int)ppfVar1 -
                      *(int *)&(this->tasks).c.
                               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (uint)(ppfVar1 == (_Map_pointer)0x0)) * 0x10;
  local_b0 = 0;
  local_c4 = std::thread::hardware_concurrency();
  github111116::ConsoleLogger::info<char[25],int,char[8]>
            (&console,(char (*) [25])"Scheduler: Starting with",&local_c4,(char (*) [8])"threads");
  iVar2 = 0;
  local_a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  if (0 < local_c4) {
    do {
      local_b8._M_id._M_thread = (id)0;
      local_c0 = (long *)operator_new(0x30);
      *local_c0 = (long)&PTR___State_0016c130;
      local_c0[1] = (long)&local_58;
      local_c0[2] = (long)this;
      local_c0[3] = (long)&local_88;
      local_c0[4] = (long)&local_b0;
      local_c0[5] = (long)&local_ac;
      std::thread::_M_start_thread(&local_b8,&local_c0,0);
      if (local_c0 != (long *)0x0) {
        (**(code **)(*local_c0 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_a8,&local_b8);
      if (local_b8._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < local_c4);
  }
  if (0 < local_c4) {
    lVar3 = 0;
    do {
      std::thread::join();
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_c4);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_a8);
  return;
}

Assistant:

void TaskScheduler::start()
{
	int total = tasks.size();
	int finished = 0;
#ifndef SINGLE_THREADED
	int n = std::thread::hardware_concurrency();
	console.info("Scheduler: Starting with", n, "threads");
	std::vector<std::thread> threads;
	std::mutex ex,ex2;
	auto work = [&](){
		try {
			while (1) {
				task_t task = NULL;
				ex.lock();
				if (!tasks.empty()) {
					task = tasks.front();
					tasks.pop();
				}
				ex.unlock();
				if (task == NULL) break;
				task();
				if (onprogress) {
					ex2.lock();
					finished += 1;
					onprogress(finished, total);
					ex2.unlock();
				}
			}
		}
		catch (const char* err) {
			console.error(err);
			throw err;
		}
	};
	for (int i=0; i<n; ++i)
		threads.push_back(std::thread(work));
	for (int i=0; i<n; ++i)
		threads[i].join();
#else
	console.warn("Scheduler: Starting single threaded");
	while (!tasks.empty()) {
		task_t task = tasks.front();
		tasks.pop();
		task();
		if (onprogress) {
			finished += 1;
			onprogress(finished, total);
		}
	}
#endif
}